

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::FileDescriptorSet::~FileDescriptorSet(FileDescriptorSet *this)

{
  FileDescriptorSet *this_local;
  
  ~FileDescriptorSet(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

FileDescriptorSet::~FileDescriptorSet() = default;